

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O0

void __thiscall cube::http::HTTPRequest::~HTTPRequest(HTTPRequest *this)

{
  HTTPRequest *this_local;
  
  std::__cxx11::string::~string((string *)&this->m_body);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->m_headers);
  std::__cxx11::string::~string((string *)&this->m_proto);
  std::__cxx11::string::~string((string *)&this->m_method);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

HTTPRequest::~HTTPRequest() {
}